

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_integer_width_for_glsl_instruction
          (CompilerGLSL *this,GLSLstd450 op,uint32_t *ops,uint32_t length)

{
  SPIRType *pSVar1;
  uint32_t length_local;
  uint32_t *ops_local;
  GLSLstd450 op_local;
  CompilerGLSL *this_local;
  
  if (length == 0) {
    this_local._4_4_ = 0x20;
  }
  else {
    switch(op) {
    case GLSLstd450SAbs:
    case GLSLstd450SSign:
    case GLSLstd450UMin:
    case GLSLstd450SMin:
    case GLSLstd450UMax:
    case GLSLstd450SMax:
    case GLSLstd450UClamp:
    case GLSLstd450SClamp:
    case GLSLstd450FindSMsb:
    case GLSLstd450FindUMsb:
      pSVar1 = Compiler::expression_type(&this->super_Compiler,*ops);
      this_local._4_4_ = pSVar1->width;
      break;
    default:
      this_local._4_4_ = 0x20;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::get_integer_width_for_glsl_instruction(GLSLstd450 op, const uint32_t *ops, uint32_t length) const
{
	if (length < 1)
		return 32;

	switch (op)
	{
	case GLSLstd450SAbs:
	case GLSLstd450SSign:
	case GLSLstd450UMin:
	case GLSLstd450SMin:
	case GLSLstd450UMax:
	case GLSLstd450SMax:
	case GLSLstd450UClamp:
	case GLSLstd450SClamp:
	case GLSLstd450FindSMsb:
	case GLSLstd450FindUMsb:
		return expression_type(ops[0]).width;

	default:
	{
		// We don't need to care about other opcodes, just return 32.
		return 32;
	}
	}
}